

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *pObj,int fThisIsPivot)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  Abc_Obj_t *pObj_00;
  uint uVar6;
  ulong uVar7;
  Abc_Ntk_t *pAVar8;
  int in_EDX;
  int Fill;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  Abc_Obj_t *pObj_01;
  long lVar11;
  
  pAVar8 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar8->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar8->vTravIds).nSize <= iVar1)) {
LAB_0087b80a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar8->vTravIds).pArray[iVar1] == iVar2) {
    return;
  }
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) goto LAB_0087b829;
  (pAVar4->vTravIds).pArray[iVar1] = iVar2;
  uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar6 == 7) {
    if (fThisIsPivot != 0) {
      uVar6 = pObj->Id * 2;
      if ((int)uVar6 < 0) goto LAB_0087b829;
      pVVar10 = pObj->pNtk->vTopo;
      iVar1 = pVVar10->nSize;
      if (iVar1 <= (int)uVar6) goto LAB_0087b829;
      pVVar10->pArray[uVar6] = iVar1;
    }
    uVar7 = (ulong)(pObj->vFanouts).nSize;
    if (0 < (long)uVar7) {
      uVar9 = 0;
      do {
        pObj_01 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar9]];
        uVar6 = pObj_01->Id * 2;
        if ((int)uVar6 < 0) goto LAB_0087b80a;
        pVVar10 = pObj_01->pNtk->vTopo;
        uVar3 = pVVar10->nSize;
        if ((int)uVar3 <= (int)uVar6) goto LAB_0087b80a;
        piVar5 = pVVar10->pArray;
        if (piVar5[uVar6] == 0) {
          if (uVar3 <= (uVar6 | 1)) goto LAB_0087b80a;
          if (piVar5[uVar6 | 1] != 0) {
            __assert_fail("!Abc_NtkTopoHasEnd(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0xa59,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
          }
          Abc_NtkReverseTopoOrder_rec(pObj_01,1);
          uVar7 = (ulong)(uint)(pObj->vFanouts).nSize;
          goto LAB_0087b78b;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      pObj_01 = (Abc_Obj_t *)0x0;
LAB_0087b78b:
      if (0 < (int)uVar7) {
        lVar11 = 0;
        do {
          pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar11]];
          if (pObj_00 != pObj_01) {
            Abc_NtkReverseTopoOrder_rec(pObj_00,0);
            uVar7 = (ulong)(uint)(pObj->vFanouts).nSize;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)uVar7);
      }
    }
    pAVar8 = pObj->pNtk;
    if (fThisIsPivot != 0) {
      if (pObj->Id * 2 < 0) {
LAB_0087b829:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar10 = pAVar8->vTopo;
      uVar6 = pObj->Id * 2 + 1;
      if (pVVar10->nSize <= (int)uVar6) goto LAB_0087b829;
      pVVar10->pArray[uVar6] = pVVar10->nSize;
      goto LAB_0087b7fa;
    }
  }
  else {
    if (uVar6 != 3) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0xa51,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
    }
    pAVar8 = pObj->pNtk;
  }
  pVVar10 = pAVar8->vTopo;
LAB_0087b7fa:
  Vec_IntPush(pVVar10,pObj->Id);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder_rec( Abc_Obj_t * pObj, int fThisIsPivot )
{
    Abc_Obj_t * pNext, * pPivot = NULL;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsPo(pObj) )
    {
        Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // mark begining
    if ( fThisIsPivot )
        Abc_NtkTopoSetBeg( pObj );        
    // find fanout without topo
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( !Abc_NtkTopoHasBeg(pNext) )
        { 
            assert( !Abc_NtkTopoHasEnd(pNext) );
            Abc_NtkReverseTopoOrder_rec( pNext, 1 );
            pPivot = pNext;
            break;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext != pPivot )
            Abc_NtkReverseTopoOrder_rec( pNext, 0 );
    // mark end
    if ( fThisIsPivot )
        Abc_NtkTopoSetEnd( pObj );
    // save current node        
    Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
}